

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ushort uVar1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar2;
  char *pcVar3;
  uint uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar5;
  ostringstream oss;
  string sStack_1e8;
  key_type local_1c8 [23];
  ValueHolder local_50;
  ushort local_48;
  CommentInfo *local_40;
  size_t local_38;
  size_t sStack_30;
  key_type *this_01;
  
  this_01 = (key_type *)(ulong)newSize;
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 != '\0') {
    if ((char)uVar1 == '\a') goto LAB_0014264f;
    this_01 = local_1c8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"in Json::Value::resize(): requires arrayValue",0x2d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1e8);
  }
  pcVar3 = (char *)operator_new(0x30);
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  *(char **)(pcVar3 + 0x18) = pcVar3 + 8;
  *(char **)(pcVar3 + 0x20) = pcVar3 + 8;
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  local_50 = this->value_;
  (this->value_).string_ = pcVar3;
  *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 7;
  local_48 = uVar1 & 0x1ff;
  local_40 = this->comments_;
  this->comments_ = (CommentInfo *)0x0;
  local_38 = this->start_;
  sStack_30 = this->limit_;
  this->start_ = 0;
  this->limit_ = 0;
  ~Value((Value *)&local_50);
LAB_0014264f:
  AVar2 = size(this);
  uVar4 = (uint)this_01;
  if (uVar4 == 0) {
    clear(this);
    return;
  }
  if (AVar2 < uVar4) {
    operator[](this,uVar4 - 1);
    return;
  }
  if (uVar4 < AVar2) {
    do {
      this_00 = &((this->value_).map_)->_M_t;
      local_1c8[0].cstr_ = (char *)0x0;
      local_1c8[0].field_1.index_ = (ArrayIndex)this_01;
      pVar5 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::equal_range(this_00,local_1c8);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
      if ((local_1c8[0].cstr_ != (char *)0x0) && ((local_1c8[0].field_1.index_ & 3) == 1)) {
        free(local_1c8[0].cstr_);
      }
      uVar4 = (ArrayIndex)this_01 + 1;
      this_01 = (key_type *)(ulong)uVar4;
    } while (AVar2 != uVar4);
  }
  return;
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
}